

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  TargetType targetType;
  int iVar4;
  cmGlobalNinjaGenerator *pcVar5;
  string *psVar6;
  char *pcVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  cmOutputConverter *outputConverter;
  pointer __rhs;
  allocator local_5ab;
  allocator local_5aa;
  allocator local_5a9;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string launcher;
  string responseFlag;
  string rspcontent;
  string rspfile;
  string langFlags;
  string ruleName;
  string local_4c8;
  string local_4a8;
  string local_488;
  string linkCmd;
  string local_448;
  string local_428;
  RuleVariables vars;
  ostringstream comment;
  ostringstream description;
  
  TVar3 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  LanguageLinkerDeviceRule_abi_cxx11_(&ruleName,this);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_local_buf[0] = '\0';
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar5,&ruleName);
  if (!bVar2) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    vars.CMTargetName = (psVar6->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    vars.Language = "CUDA";
    responseFlag.field_2._M_local_buf[0] = '\0';
    if (useResponseFile) {
      std::__cxx11::string::string((string *)&comment,"CMAKE_",(allocator *)&description);
      std::__cxx11::string::append((string *)&comment);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     "_RESPONSE_FILE_LINK_FLAG");
      cmMakefile::GetDefinition
                ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                 (string *)&description);
      std::__cxx11::string::assign((char *)&responseFlag);
      std::__cxx11::string::assign((char *)&rspfile);
      std::__cxx11::string::append((string *)&responseFlag);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign((char *)&rspcontent);
      std::__cxx11::string::append((char *)&rspcontent);
      vars.Objects = responseFlag._M_dataplus._M_p;
      vars.LinkLibraries = "";
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&comment);
    }
    else {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_LIBRARIES";
    }
    vars.ObjectDir = "$OBJECT_DIR";
    vars.Target = "$TARGET_FILE";
    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
    langFlags._M_string_length = 0;
    vars.Manifests = "$MANIFESTS";
    langFlags.field_2._M_local_buf[0] = '\0';
    if (TVar3 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
      vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
    }
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string((string *)&comment,"RULE_LAUNCH_LINK",(allocator *)&description);
    pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,target,(string *)&comment)
    ;
    std::__cxx11::string::~string((string *)&comment);
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      std::__cxx11::string::assign((char *)&launcher);
      std::__cxx11::string::append((char *)&launcher);
    }
    iVar4 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    rulePlaceholderExpander.x_ = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar4);
    ComputeDeviceLinkCmd_abi_cxx11_(&linkCmds,this);
    for (__rhs = linkCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __rhs != linkCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (rulePlaceholderExpander.x_,outputConverter,__rhs,&vars);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    cmLocalNinjaGenerator::BuildCommandLine
              (&linkCmd,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar8 = std::operator<<((ostream *)&comment,"Rule for linking ");
    poVar8 = std::operator<<(poVar8,(string *)&this->TargetLinkLanguage);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar8 = std::operator<<((ostream *)&description,"Linking ");
    poVar8 = std::operator<<(poVar8,(string *)&this->TargetLinkLanguage);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8," $TARGET_FILE");
    pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_4c8,"",&local_5a9);
    std::__cxx11::string::string((string *)&local_428,"",&local_5aa);
    std::__cxx11::string::string((string *)&local_448,"$RESTAT",&local_5ab);
    cmGlobalNinjaGenerator::AddRule
              (pcVar5,&ruleName,&linkCmd,&local_488,&local_4a8,&local_4c8,&local_428,&rspfile,
               &rspcontent,&local_448,false);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&linkCmd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&rulePlaceholderExpander);
    std::__cxx11::string::~string((string *)&launcher);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::~string((string *)&responseFlag);
  }
  std::__cxx11::string::~string((string *)&rspcontent);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&ruleName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerDeviceRule();
  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = "CUDA";

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::vector<std::string>::iterator i = linkCmds.begin();
         i != linkCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }
}